

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

ON_Locale *
ON_Locale::FromSubtags
          (ON_Locale *__return_storage_ptr__,char *language_code,char *script,
          char *region_identifier)

{
  char *language_name_00;
  ON_String local_48;
  ON_String REGION;
  char Script [6];
  ON_String local_28;
  ON_String language_name;
  char *region_identifier_local;
  char *script_local;
  char *language_code_local;
  
  language_name.m_s = region_identifier;
  if ((language_code == (char *)0x0) || (*language_code == '\0')) {
    memcpy(__return_storage_ptr__,&InvariantCulture,0xa0);
  }
  else {
    ON_String::ON_String(&local_28,language_code);
    ON_String::MakeLowerOrdinal(&local_28);
    if ((script != (char *)0x0) &&
       ((*script != '\0' ||
        ((((script[1] != '\0' && (script[2] != '\0')) && (script[3] != '\0')) && (script[4] == '\0')
         ))))) {
      REGION.m_s._6_1_ = 0x2d;
      REGION.m_s._7_1_ = ON_String::MapCharacterOrdinal(UpperOrdinal,*script);
      ON_String::MapCharacterOrdinal(LowerOrdinal,*script);
      ON_String::MapCharacterOrdinal(LowerOrdinal,*script);
      ON_String::MapCharacterOrdinal(LowerOrdinal,*script);
      ON_String::operator+=(&local_28,(char *)((long)&REGION.m_s + 6));
    }
    if ((language_name.m_s != (char *)0x0) && (*language_name.m_s != '\0')) {
      ON_String::ON_String(&local_48,'-',1);
      ON_String::operator+=(&local_48,language_name.m_s);
      ON_String::MakeUpperOrdinal(&local_48);
      ON_String::operator+=(&local_28,&local_48);
      ON_String::~ON_String(&local_48);
    }
    language_name_00 = ON_String::operator_cast_to_char_(&local_28);
    FromBCP47LanguageName(__return_storage_ptr__,language_name_00);
    ON_String::~ON_String(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromSubtags(
  const char* language_code,
  const char* script,
  const char* region_identifier
  )
{
  if (nullptr == language_code || 0 == language_code[0])
    return ON_Locale::InvariantCulture;

  ON_String language_name(language_code);
  language_name.MakeLowerOrdinal();

  if ( nullptr != script && (0 != script[0] || (0 != script[1] && 0 != script[2] && 0 != script[3] && 0 == script[4])) )
  {
    char Script[6];
    Script[0] = '-';
    Script[1] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::UpperOrdinal,script[0]);
    Script[2] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::LowerOrdinal,script[0]);
    Script[3] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::LowerOrdinal,script[0]);
    Script[4] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::LowerOrdinal,script[0]);
    Script[5] = 0;
    language_name += Script;
  }

  if (nullptr != region_identifier && 0 != region_identifier[0])
  {
    ON_String REGION = '-';
    REGION += region_identifier;
    REGION.MakeUpperOrdinal();
    language_name += REGION;
  }

  return ON_Locale::FromBCP47LanguageName(language_name);
}